

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawElementsBaseVertexTests.cpp
# Opt level: O1

IterateResult __thiscall
glcts::DrawElementsBaseVertexNegativeInvalidTypeArgumentTest::iterate
          (DrawElementsBaseVertexNegativeInvalidTypeArgumentTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ostream *poVar5;
  MessageBuilder *pMVar6;
  TestError *pTVar7;
  uint uVar8;
  GLvoid *offsets [1];
  GLsizei count;
  stringstream error_sstream;
  long *local_370;
  long local_360 [2];
  GLuint *local_350;
  undefined4 local_344;
  undefined1 local_340 [8];
  _func_int **local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [6];
  ios_base local_2c8 [264];
  char *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8;
  long lVar4;
  
  iVar2 = (*((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.m_context)->m_renderCtx
            ->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  uVar8 = 0;
  do {
    uVar3 = (*((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.m_context)->
              m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar8 == 0) || ((uVar3 & 0x300) == 0)) {
      DrawElementsBaseVertexTestBase::setUpNegativeTestObjects
                (&this->super_DrawElementsBaseVertexTestBase,1 < uVar8,(bool)((byte)uVar8 & 1));
      (**(code **)(lVar4 + 0x570))
                (4,3,0,(this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset,0);
      iVar2 = (**(code **)(lVar4 + 0x800))();
      if (iVar2 != 0x500) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,"Invalid error code reported for an invalid ",0x2b);
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  ((string *)local_340,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (&local_1a8,(char *)local_340,(long)local_338);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," call",5);
        if (local_340 != (undefined1  [8])local_330) {
          operator_delete((void *)local_340,local_330[0]._M_allocated_capacity + 1);
        }
        local_340 = (undefined1  [8])
                    ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_338);
        std::__cxx11::stringbuf::str();
        pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_340,(char **)&local_350);
        poVar1 = &pMVar6->m_str;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                   ": expected GL_INVALID_ENUM, got:[",0x21);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]",1);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_370 != local_360) {
          operator_delete(local_370,local_360[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_338);
        std::ios_base::~ios_base(local_2c8);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        tcu::TestError::TestError
                  (pTVar7,(char *)local_340,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xc8a);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar4 + 0x5a8))
                (4,0,2,3,0,(this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset,0);
      iVar2 = (**(code **)(lVar4 + 0x800))();
      if (iVar2 != 0x500) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,"Invalid error code reported for an invalid ",0x2b);
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  ((string *)local_340,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (&local_1a8,(char *)local_340,(long)local_338);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," call",5);
        if (local_340 != (undefined1  [8])local_330) {
          operator_delete((void *)local_340,local_330[0]._M_allocated_capacity + 1);
        }
        local_340 = (undefined1  [8])
                    ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_338);
        std::__cxx11::stringbuf::str();
        pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_340,(char **)&local_350);
        poVar1 = &pMVar6->m_str;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                   ": expected GL_INVALID_ENUM, got:[",0x21);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]",1);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_370 != local_360) {
          operator_delete(local_370,local_360[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_338);
        std::ios_base::~ios_base(local_2c8);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        tcu::TestError::TestError
                  (pTVar7,(char *)local_340,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xca0);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar4 + 0x590))
                (4,3,0,(this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset,1,0);
      iVar2 = (**(code **)(lVar4 + 0x800))();
      if (iVar2 != 0x500) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,"Invalid error code reported for an invalid ",0x2b);
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  ((string *)local_340,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (&local_1a8,(char *)local_340,(long)local_338);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," call",5);
        if (local_340 != (undefined1  [8])local_330) {
          operator_delete((void *)local_340,local_330[0]._M_allocated_capacity + 1);
        }
        local_340 = (undefined1  [8])
                    ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_338);
        std::__cxx11::stringbuf::str();
        pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_340,(char **)&local_350);
        poVar1 = &pMVar6->m_str;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                   ": expected GL_INVALID_ENUM, got:[",0x21);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]",1);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_370 != local_360) {
          operator_delete(local_370,local_360[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_338);
        std::ios_base::~ios_base(local_2c8);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        tcu::TestError::TestError
                  (pTVar7,(char *)local_340,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xcb5);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if ((this->super_DrawElementsBaseVertexTestBase).m_is_ext_multi_draw_arrays_supported == true)
      {
        local_344 = 3;
        local_350 = (this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset;
        (**(code **)(lVar4 + 0xde8))(4,&local_344,0,&local_350,1,0);
        iVar2 = (**(code **)(lVar4 + 0x800))();
        if (iVar2 != 0x500) {
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&local_1a8,"Invalid error code reported for an invalid ",0x2b);
          DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                    ((string *)local_340,&this->super_DrawElementsBaseVertexTestBase,
                     FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (&local_1a8,(char *)local_340,(long)local_338);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," call",5);
          if (local_340 != (undefined1  [8])local_330) {
            operator_delete((void *)local_340,local_330[0]._M_allocated_capacity + 1);
          }
          local_340 = (undefined1  [8])
                      ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.
                       super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_338);
          std::__cxx11::stringbuf::str();
          pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_340,&local_1c0);
          poVar1 = &pMVar6->m_str;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                     ": expected GL_INVALID_ENUM, got:[",0x21);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]",1);
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if (local_370 != local_360) {
            operator_delete(local_370,local_360[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_338);
          std::ios_base::~ios_base(local_2c8);
          pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          tcu::TestError::TestError
                    (pTVar7,(char *)local_340,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                     ,0xcce);
          __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
      }
    }
    uVar8 = uVar8 + 1;
    if (uVar8 == 4) {
      tcu::TestContext::setTestResult
                ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult DrawElementsBaseVertexNegativeInvalidTypeArgumentTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* The test needs to be run in four iterations, where for each iteration we configure the VAO
	 * in a slightly different manner.
	 */
	for (int iteration = 0; iteration < 4; ++iteration)
	{
		bool use_clientside_index_data  = ((iteration & (1 << 0)) != 0);
		bool use_clientside_vertex_data = ((iteration & (1 << 1)) != 0);

		/* OpenGL does not support client-side data. */
		if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			if (use_clientside_index_data || use_clientside_vertex_data)
			{
				continue;
			}
		}

		/* Set up the work environment */
		setUpNegativeTestObjects(use_clientside_vertex_data, use_clientside_index_data);

		/* Try to execute the invalid draw calls */
		glw::GLenum error_code = GL_NONE;

		gl.drawElementsBaseVertex(GL_TRIANGLES,												 /* mode */
								  3,														 /* count */
								  GL_NONE, (const glw::GLvoid*)m_draw_call_index_offset, 0); /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_ENUM)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code reported for an invalid "
						  << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX) << " call";

			m_testCtx.getLog() << tcu::TestLog::Message << error_sstream.str().c_str()
							   << ": expected GL_INVALID_ENUM, got:"
								  "["
							   << error_code << "]" << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		}

		gl.drawRangeElementsBaseVertex(GL_TRIANGLES,											  /* mode */
									   0,														  /* start */
									   2,														  /* end */
									   3,														  /* count */
									   GL_NONE, (const glw::GLvoid*)m_draw_call_index_offset, 0); /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_ENUM)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code reported for an invalid "
						  << getFunctionName(FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX) << " call";

			m_testCtx.getLog() << tcu::TestLog::Message << error_sstream.str().c_str()
							   << ": expected GL_INVALID_ENUM, got:"
								  "["
							   << error_code << "]" << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		}

		gl.drawElementsInstancedBaseVertex(GL_TRIANGLES,											 /* mode */
										   3,														 /* count */
										   GL_NONE, (const glw::GLvoid*)m_draw_call_index_offset, 1, /* instancecount */
										   0);														 /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_ENUM)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code reported for an invalid "
						  << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX) << " call";

			m_testCtx.getLog() << tcu::TestLog::Message << error_sstream.str().c_str()
							   << ": expected GL_INVALID_ENUM, got:"
								  "["
							   << error_code << "]" << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		}

		if (m_is_ext_multi_draw_arrays_supported)
		{
			const glw::GLsizei count	 = 3;
			const glw::GLvoid* offsets[] = { (const glw::GLvoid*)m_draw_call_index_offset };

			gl.multiDrawElementsBaseVertex(GL_TRIANGLES,				/* mode */
										   &count, GL_NONE, offsets, 1, /* primcount */
										   0);							/* basevertex */

			error_code = gl.getError();
			if (error_code != GL_INVALID_ENUM)
			{
				std::stringstream error_sstream;

				error_sstream << "Invalid error code reported for an invalid "
							  << getFunctionName(FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX) << " call";

				m_testCtx.getLog() << tcu::TestLog::Message << error_sstream.str().c_str()
								   << ": expected GL_INVALID_ENUM, got:"
									  "["
								   << error_code << "]" << tcu::TestLog::EndMessage;

				TCU_FAIL(error_sstream.str().c_str());
			}
		} /* if (m_is_ext_multi_draw_arrays_supported) */
	}	 /* for (all test iterations) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}